

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialBeamANCF.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChMaterialBeamANCF::Calc_D0_Dv
          (ChMaterialBeamANCF *this,ChVector<double> *E,ChVector<double> *nu,ChVector<double> *G,
          double k1,double k2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  dVar1 = nu->m_data[0];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = nu->m_data[1];
  dVar2 = nu->m_data[2];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar2;
  dVar3 = E->m_data[0];
  auVar7._0_8_ = (dVar1 * E->m_data[1]) / dVar3;
  auVar7._8_8_ = 0;
  auVar11._0_8_ = (E->m_data[2] * nu->m_data[1]) / dVar3;
  auVar11._8_8_ = 0;
  auVar15._0_8_ = (E->m_data[2] * dVar2) / E->m_data[1];
  auVar15._8_8_ = 0;
  auVar9 = ZEXT816(0x3ff0000000000000);
  auVar4 = vfnmadd213sd_fma(auVar15,auVar10,auVar9);
  auVar5 = vfnmadd213sd_fma(auVar7,auVar6,auVar4);
  auVar5 = vfnmadd231sd_fma(auVar5,auVar8,auVar11);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar2 * dVar1;
  auVar5 = vfnmadd213sd_fma(auVar14,auVar11,auVar5);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = auVar15._0_8_ * auVar7._0_8_;
  auVar5 = vfnmadd213sd_fma(auVar13,auVar8,auVar5);
  (this->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [0] = dVar3;
  dVar1 = E->m_data[1];
  (this->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [1] = dVar1;
  dVar2 = E->m_data[2];
  (this->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [2] = dVar2;
  (this->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [3] = G->m_data[2];
  (this->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [4] = k1 * G->m_data[1];
  (this->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
  [5] = k2 * G->m_data[0];
  dVar12 = auVar5._0_8_;
  (this->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
  [0] = (auVar4._0_8_ * E->m_data[0]) / dVar12 - dVar3;
  auVar4 = vfmadd213sd_fma(auVar15,auVar7,auVar11);
  auVar5 = vfmadd213sd_fma(auVar11,auVar6,auVar15);
  auVar13 = vfmadd213sd_fma(auVar15,auVar8,auVar6);
  (this->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
  [3] = (auVar13._0_8_ * E->m_data[1]) / dVar12;
  auVar13 = vfmadd213sd_fma(auVar10,auVar6,auVar8);
  (this->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
  [6] = (auVar13._0_8_ * E->m_data[2]) / dVar12;
  auVar13 = vfmadd213sd_fma(auVar11,auVar10,auVar7);
  (this->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
  [1] = (auVar13._0_8_ * E->m_data[0]) / dVar12;
  auVar13 = vfnmadd213sd_fma(auVar11,auVar8,auVar9);
  (this->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
  [4] = (auVar13._0_8_ * E->m_data[1]) / dVar12 - dVar1;
  auVar13 = vfmadd213sd_fma(auVar8,auVar7,auVar10);
  (this->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
  [7] = (auVar13._0_8_ * E->m_data[2]) / dVar12;
  (this->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
  [2] = (auVar4._0_8_ * E->m_data[0]) / dVar12;
  (this->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
  [5] = (auVar5._0_8_ * E->m_data[1]) / dVar12;
  auVar4 = vfnmadd213sd_fma(auVar7,auVar6,auVar9);
  (this->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
  [8] = (auVar4._0_8_ * E->m_data[2]) / dVar12 - dVar2;
  return;
}

Assistant:

void ChMaterialBeamANCF::Calc_D0_Dv(const ChVector<>& E,
                                    const ChVector<>& nu,
                                    const ChVector<>& G,
                                    double k1,
                                    double k2) {
    // orthotropic material ref: http://homes.civil.aau.dk/lda/Continuum/material.pdf
    // except position of the shear terms is different to match the original ANCF reference paper
    //
    // Assumed Voigt Notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]

    double nu_12 = nu.x();
    double nu_13 = nu.y();
    double nu_23 = nu.z();
    double nu_21 = nu_12 * E.y() / E.x();
    double nu_31 = nu_13 * E.z() / E.x();
    double nu_32 = nu_23 * E.z() / E.y();
    double k = 1.0 - nu_23 * nu_32 - nu_12 * nu_21 - nu_13 * nu_31 - nu_12 * nu_23 * nu_31 - nu_21 * nu_32 * nu_13;

    // Component of Stiffness Tensor that does not contain the Poisson Effect
    m_D0(0) = E.x();
    m_D0(1) = E.y();
    m_D0(2) = E.z();
    m_D0(3) = G.z();
    m_D0(4) = G.y() * k1;
    m_D0(5) = G.x() * k2;

    // Remaining components of the Stiffness Tensor that contain the Poisson Effect
    m_Dv(0, 0) = E.x() * (1 - nu_23 * nu_32) / k - m_D0(0);
    m_Dv(1, 0) = E.y() * (nu_13 * nu_32 + nu_12) / k;
    m_Dv(2, 0) = E.z() * (nu_12 * nu_23 + nu_13) / k;

    m_Dv(0, 1) = E.x() * (nu_23 * nu_31 + nu_21) / k;
    m_Dv(1, 1) = E.y() * (1 - nu_13 * nu_31) / k - m_D0(1);
    m_Dv(2, 1) = E.z() * (nu_13 * nu_21 + nu_23) / k;

    m_Dv(0, 2) = E.x() * (nu_21 * nu_32 + nu_31) / k;
    m_Dv(1, 2) = E.y() * (nu_12 * nu_31 + nu_32) / k;
    m_Dv(2, 2) = E.z() * (1 - nu_12 * nu_21) / k - m_D0(2);
}